

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-version.c
# Opt level: O2

int main(void)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  fprintf(_stderr,"Library version: \"%s\".\n","0.1.0");
  iVar1 = green_version();
  if (iVar1 == 100) {
    pcVar2 = green_version_string();
    iVar1 = strcmp(pcVar2,"0.1.0");
    if (iVar1 == 0) {
      iVar1 = _green_init(1,1);
      if (iVar1 == 1) {
        iVar1 = _green_init(0,2);
        if (iVar1 == 1) {
          return 0;
        }
        pcVar2 = "(_green_init(0, 1+1)) == (1)";
        uStack_10 = 0x25;
      }
      else {
        pcVar2 = "(_green_init(0+1, 1)) == (1)";
        uStack_10 = 0x24;
      }
    }
    else {
      pcVar2 = "strcmp(green_version_string(), \"0\" \".\" \"1\" \".\" \"0\") == 0";
      uStack_10 = 0x14;
    }
  }
  else {
    pcVar2 = "(green_version()) == (((0 * 10000) + (1 * 100) + 0))";
    uStack_10 = 0x13;
  }
  fprintf(_stderr,"Test failed at %s:%d: \'%s\'.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/AndreLouisCaron[P]libgreen/tests/test-version.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

int main()
{
    fprintf(stderr, "Library version: \"%s\".\n", GREEN_VERSION_STRING);

    // Compile-time and run-time checks should be equal since we're not
    // building in a compatibility configuration.
    check_eq(green_version(), GREEN_VERSION);
    check_str_eq(green_version_string(), GREEN_VERSION_STRING);

    // Make sure ordering make sense.
    check_eq(GREEN_MAKE_VERSION(1, 0, 0),
             GREEN_MAKE_VERSION(1, 0, 0));
    check_lt(GREEN_MAKE_VERSION(1, 0, 0),
             GREEN_MAKE_VERSION(1, 0, 1));
    check_lt(GREEN_MAKE_VERSION(1, 0, 1),
             GREEN_MAKE_VERSION(1, 1, 0));
    check_lt(GREEN_MAKE_VERSION(1, 0, 0),
             GREEN_MAKE_VERSION(1, 1, 0));
    check_lt(GREEN_MAKE_VERSION(1, 0, 0),
             GREEN_MAKE_VERSION(2, 0, 0));
    check_lt(GREEN_MAKE_VERSION(1, 1, 0),
             GREEN_MAKE_VERSION(2, 0, 0));

    check_eq(_green_init(GREEN_MAJOR+1, GREEN_MINOR), 1);
    check_eq(_green_init(GREEN_MAJOR, GREEN_MINOR+1), 1);

    return EXIT_SUCCESS;
}